

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile.c
# Opt level: O0

LY_ERR lys_compile_ext(lysc_ctx *ctx,lysp_ext_instance *extp,lysc_ext_instance *ext,void *parent)

{
  void *local_d8;
  lysp_ext_instance *local_b8;
  lysp_ext_instance *local_a8;
  lysp_ext_instance *local_90;
  lysp_ext_instance *local_80;
  void *local_60;
  void *local_58;
  lys_module *local_50;
  long *local_40;
  char *p__;
  uint64_t __u;
  LY_ERR ret;
  void *parent_local;
  lysc_ext_instance *ext_local;
  lysp_ext_instance *extp_local;
  lysc_ctx *ctx_local;
  
  __u._4_4_ = lydict_dup(ctx->ctx,extp->argument,&ext->argument);
  if (__u._4_4_ == LY_SUCCESS) {
    ext->module = ctx->cur_mod;
    ext->parent = parent;
    ext->parent_stmt = extp->parent_stmt;
    ext->parent_stmt_index = extp->parent_stmt_index;
    if ((ext->parent_stmt &
        (LY_STMT_USES|LY_STMT_LIST|LY_STMT_LEAF_LIST|LY_STMT_LEAF|LY_STMT_GROUPING|LY_STMT_CONTAINER
         |LY_STMT_CHOICE|LY_STMT_CASE|LY_STMT_AUGMENT|LY_STMT_ANYXML|LY_STMT_ANYDATA|LY_STMT_RPC|
         LY_STMT_ACTION|LY_STMT_OUTPUT|LY_STMT_INPUT|LY_STMT_NOTIFICATION)) == LY_STMT_NONE) {
      local_50 = (lys_module *)0x0;
    }
    else {
      local_50 = *(lys_module **)((long)ext->parent + 8);
    }
    lysc_update_path(ctx,local_50,"{extension}");
    lysc_update_path(ctx,(lys_module *)0x0,extp->name);
    __u._4_4_ = lys_compile_extension(ctx,extp,&ext->def);
    if (__u._4_4_ == LY_SUCCESS) {
      if (extp->exts == (lysp_ext_instance *)0x0) {
LAB_00160ce8:
        if ((ext->def->plugin != (lyplg_ext *)0x0) &&
           (ext->def->plugin->compile != (lyplg_ext_compile_clb)0x0)) {
          if (ext->argument != (char *)0x0) {
            lysc_update_path(ctx,ext->module,ext->argument);
          }
          __u._4_4_ = (*ext->def->plugin->compile)(ctx,extp,ext);
          if (__u._4_4_ == LY_ENOT) {
            lysc_ext_instance_free(&ctx->free_ctx,ext);
          }
          if (ext->argument != (char *)0x0) {
            lysc_update_path(ctx,(lys_module *)0x0,(char *)0x0);
          }
        }
      }
      else {
        if (ext->exts == (lysc_ext_instance *)0x0) {
          local_60 = (void *)0x0;
        }
        else {
          if (ext->exts == (lysc_ext_instance *)0x0) {
            local_58 = (void *)0x0;
          }
          else {
            local_58 = ext->exts[-1].compiled;
          }
          local_60 = local_58;
        }
        if (ext->exts == (lysc_ext_instance *)0x0) {
          if (extp->exts == (lysp_ext_instance *)0x0) {
            local_90 = (lysp_ext_instance *)0x0;
          }
          else {
            local_90 = extp->exts[-1].exts;
          }
          local_40 = (long *)calloc(1,((long)local_60 + (long)local_90) * 0x48 + 8);
          if (local_40 != (long *)0x0) goto LAB_00160b14;
          ly_log(ctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lys_compile_ext");
          __u._4_4_ = LY_EMEM;
        }
        else {
          if (extp->exts == (lysp_ext_instance *)0x0) {
            local_80 = (lysp_ext_instance *)0x0;
          }
          else {
            local_80 = extp->exts[-1].exts;
          }
          local_40 = (long *)realloc(&ext->exts[-1].compiled,
                                     ((long)ext->exts[-1].compiled + (long)local_60 + (long)local_80
                                     ) * 0x48 + 8);
          if (local_40 != (long *)0x0) {
LAB_00160b14:
            ext->exts = (lysc_ext_instance *)(local_40 + 1);
            if (ext->exts != (lysc_ext_instance *)0x0) {
              if (extp->exts == (lysp_ext_instance *)0x0) {
                local_a8 = (lysp_ext_instance *)0x0;
              }
              else {
                local_a8 = extp->exts[-1].exts;
              }
              memset(ext->exts + *local_40,0,((long)local_60 + (long)local_a8) * 0x48);
            }
            p__ = (char *)0x0;
            do {
              if (extp->exts == (lysp_ext_instance *)0x0) {
                local_b8 = (lysp_ext_instance *)0x0;
              }
              else {
                local_b8 = extp->exts[-1].exts;
              }
              if (local_b8 <= p__) goto LAB_00160ce8;
              ext->exts[-1].compiled = (void *)((long)ext->exts[-1].compiled + 1);
              if (ext->exts == (lysc_ext_instance *)0x0) {
                local_d8 = (void *)0x0;
              }
              else {
                local_d8 = ext->exts[-1].compiled;
              }
              __u._4_4_ = lys_compile_ext(ctx,extp->exts + (long)p__,ext->exts + (long)local_d8 + -1
                                          ,ext);
              if (__u._4_4_ == LY_ENOT) {
                ext->exts[-1].compiled = (void *)((long)ext->exts[-1].compiled + -1);
                __u._4_4_ = LY_SUCCESS;
              }
              else if (__u._4_4_ != LY_SUCCESS) goto LAB_00160d95;
              p__ = p__ + 1;
            } while( true );
          }
          ly_log(ctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lys_compile_ext");
          __u._4_4_ = LY_EMEM;
        }
      }
    }
  }
LAB_00160d95:
  lysc_update_path(ctx,(lys_module *)0x0,(char *)0x0);
  lysc_update_path(ctx,(lys_module *)0x0,(char *)0x0);
  return __u._4_4_;
}

Assistant:

LY_ERR
lys_compile_ext(struct lysc_ctx *ctx, struct lysp_ext_instance *extp, struct lysc_ext_instance *ext, void *parent)
{
    LY_ERR ret = LY_SUCCESS;

    DUP_STRING_GOTO(ctx->ctx, extp->argument, ext->argument, ret, cleanup);
    ext->module = ctx->cur_mod;
    ext->parent = parent;
    ext->parent_stmt = extp->parent_stmt;
    ext->parent_stmt_index = extp->parent_stmt_index;

    lysc_update_path(ctx, (ext->parent_stmt & LY_STMT_NODE_MASK) ? ((struct lysc_node *)ext->parent)->module : NULL,
            "{extension}");
    lysc_update_path(ctx, NULL, extp->name);

    /* compile extension if not already */
    LY_CHECK_GOTO(ret = lys_compile_extension(ctx, extp, &ext->def), cleanup);

    /* compile nested extensions */
    COMPILE_EXTS_GOTO(ctx, extp->exts, ext->exts, ext, ret, cleanup);

    /* compile this extension */
    if (ext->def->plugin && ext->def->plugin->compile) {
        if (ext->argument) {
            lysc_update_path(ctx, ext->module, ext->argument);
        }
        ret = ext->def->plugin->compile(ctx, extp, ext);
        if (ret == LY_ENOT) {
            lysc_ext_instance_free(&ctx->free_ctx, ext);
        }
        if (ext->argument) {
            lysc_update_path(ctx, NULL, NULL);
        }
        LY_CHECK_GOTO(ret, cleanup);
    }

cleanup:
    lysc_update_path(ctx, NULL, NULL);
    lysc_update_path(ctx, NULL, NULL);
    return ret;
}